

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939spy.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int *piVar5;
  cmsghdr *__cmsg;
  tm *ptVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  size_t local_a8;
  ulong uStack_a0;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  j1939_filter filt;
  uint64_t dst_name;
  sockaddr_can local_48;
  
  iVar1 = s.time;
LAB_001025a7:
  do {
    while (s.time = iVar1, iVar1 = getopt_long(argc,argv,"vPb:t::?",long_opts,0), iVar1 < 0x62) {
      if (iVar1 != 0x50) {
        if (iVar1 != -1) {
LAB_00102c1c:
          fputs("j1939spy: An SAE J1939 spy utility\nUsage: j1939spy [OPTION...] [[IFACE:][NAME|SA][,PGN]]\nOptions:\n  -P, --promisc\t\tRun in promiscuous mode\n\t\t\t(= receive traffic not for this ECU)\n  -b, --block=SIZE\tUse a receive buffer of SIZE (default 1024)\n  -t, --time[=a|d|z|A]\tShow time: (a)bsolute, (d)elta, (z)ero, (A)bsolute w date\n"
                ,_stderr);
          exit(1);
        }
        pcVar10 = argv[_optind];
        if ((pcVar10 != (char *)0x0) &&
           (_optarg = pcVar10, iVar1 = libj1939_str2addr(pcVar10,(char **)0x0,&s.addr), iVar1 < 0))
        {
          pcVar11 = "bad URI %s";
          uVar13 = 0;
          pcVar10 = _optarg;
          goto LAB_00102c9c;
        }
        iVar1 = s.pkt_len;
        buf = (uint8_t *)malloc((long)s.pkt_len);
        if (buf == (uint8_t *)0x0) {
          pcVar10 = "malloc %u";
          uVar13 = 1;
          goto LAB_00102c07;
        }
        iVar1 = socket(0x1d,2,7);
        if (iVar1 < 0) {
          pcVar10 = "socket(can, dgram, j1939)";
          goto LAB_00102cb3;
        }
        filt.pgn = 0;
        filt.pgn_mask = 0;
        filt.addr = '\0';
        filt.addr_mask = '\0';
        filt._26_6_ = 0;
        filt.name = 0;
        filt.name_mask = 0;
        if (s.addr.can_addr.j1939.name != 0) {
          filt.name = s.addr.can_addr.j1939.name;
          filt.name_mask = 0xffffffffffffffff;
        }
        if (s.addr.can_addr.j1939.addr == 0xff) {
          if (s.addr.can_addr.j1939.pgn < 0x40000) goto LAB_001026fd;
          if (s.addr.can_addr.j1939.name != 0) goto LAB_00102709;
        }
        else {
          filt.addr_mask = 0xff;
          filt.addr = s.addr.can_addr.j1939.addr;
          filt._26_6_ = 0;
          if (s.addr.can_addr.j1939.pgn < 0x40000) {
LAB_001026fd:
            filt.pgn_mask = 0xffffffff;
            filt.pgn = s.addr.can_addr.j1939.pgn;
          }
LAB_00102709:
          iVar2 = setsockopt(iVar1,0x6b,1,&filt,0x20);
          if (iVar2 < 0) {
            pcVar10 = "setsockopt filter";
            goto LAB_00102cb3;
          }
        }
        if ((s.promisc == 0) || (iVar2 = setsockopt(iVar1,0x6b,2,&ival_1,4), -1 < iVar2)) {
          if ((s.time == 0) || (iVar2 = setsockopt(iVar1,1,0x1d,&ival_1,4), -1 < iVar2)) {
            iVar2 = setsockopt(iVar1,1,8,&s.pkt_len,4);
            if (iVar2 < 0) {
              pcVar10 = "setsockopt rcvbuf %u";
              iVar1 = s.pkt_len;
              goto LAB_00102c02;
            }
            local_48.can_addr.tp.rx_id = 0;
            local_48.can_addr.tp.tx_id = 0;
            local_48._0_8_ = (ulong)(uint)s.addr.can_ifindex << 0x20;
            local_48.can_family = 0x1d;
            local_48.can_addr._8_8_ = 0xff00040000;
            iVar2 = bind(iVar1,(sockaddr *)&local_48,0x18);
            if (iVar2 < 0) {
              pcVar11 = "bind(%s)";
              uVar13 = 1;
              pcVar10 = argv[1];
LAB_00102c9c:
              err(uVar13,pcVar11,pcVar10);
            }
            iov.iov_base = buf;
            msg.msg_iov = &iov;
            msg.msg_iovlen = 1;
            msg.msg_control = ctrlmsg;
            local_88 = 0;
            local_90 = 0;
            msg.msg_name = &local_48;
            goto LAB_00102855;
          }
          pcVar10 = "setsockopt timestamp";
        }
        else {
          pcVar10 = "setsockopt promisc";
        }
LAB_00102cb3:
        err(1,pcVar10);
      }
      s.promisc = s.promisc + 1;
      iVar1 = s.time;
    }
    if (iVar1 != 0x74) {
      if (iVar1 != 0x62) goto LAB_00102c1c;
      uVar3 = strtoul(_optarg,(char **)0x0,0);
      s.pkt_len = (int)uVar3;
      iVar1 = s.time;
      goto LAB_001025a7;
    }
    if (_optarg == (char *)0x0) {
      s.time = 0x7a;
      iVar1 = s.time;
      goto LAB_001025a7;
    }
    iVar1 = (int)*_optarg;
    pvVar4 = memchr("adzA",iVar1,5);
  } while (pvVar4 != (void *)0x0);
  pcVar10 = "unknown time option \'%c\'";
  uVar13 = 1;
  goto LAB_00102c07;
  while( true ) {
    piVar5 = __errno_location();
    if (*piVar5 != 4) break;
LAB_00102855:
    iov.iov_len = (size_t)s.pkt_len;
    msg.msg_namelen = 0x18;
    msg.msg_controllen = 0x68;
    msg.msg_flags = 0;
    uVar3 = recvmsg(iVar1,(msghdr *)&msg,0);
    uVar16 = (uint)uVar3;
    if (-1 < (int)uVar16) {
      uVar15 = 0;
      cmsg = (cmsghdr *)0x0;
      if (0xf < msg.msg_controllen) {
        cmsg = (cmsghdr *)msg.msg_control;
      }
      if (cmsg == (cmsghdr *)0x0) {
        local_80 = 0;
        bVar7 = 0;
        cmsg = (cmsghdr *)0x0;
      }
      else {
        uVar15 = 0;
        local_80 = 0;
        bVar7 = 0;
        __cmsg = (cmsghdr *)msg.msg_control;
        do {
          if (__cmsg->cmsg_level == 0x6b) {
            uVar8 = __cmsg->cmsg_type;
            uVar15 = uVar15 | 1L << ((ulong)uVar8 & 0x3f);
            if (uVar8 == 3) {
              bVar7 = (byte)__cmsg[1].cmsg_len;
            }
            else if (uVar8 == 2) {
              memcpy(&dst_name,__cmsg + 1,__cmsg->cmsg_len - 0x10);
            }
            else if (uVar8 == 1) {
              local_80 = (ulong)CONCAT31((int3)(uVar8 >> 8),(char)__cmsg[1].cmsg_len);
            }
          }
          else if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 0x1d)) {
            local_a8 = __cmsg[1].cmsg_len;
            uStack_a0._0_4_ = __cmsg[1].cmsg_level;
            uStack_a0._4_4_ = __cmsg[1].cmsg_type;
            uVar15 = uVar15 | 1L << ((ulong)(byte)__cmsg->cmsg_type & 0x3f);
          }
          __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg);
          cmsg = (cmsghdr *)__cmsg;
        } while (__cmsg != (cmsghdr *)0x0);
        if (((uint)uVar15 >> 0x1d & 1) != 0) {
          if (s.time < 100) {
            if (s.time == 0x41) {
              ptVar6 = localtime((time_t *)&local_a8);
              printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",(ulong)(ptVar6->tm_year + 0x76c),
                     (ulong)(ptVar6->tm_mon + 1),(ulong)(uint)ptVar6->tm_mday,
                     (ulong)(uint)ptVar6->tm_hour,(ulong)(uint)ptVar6->tm_min,
                     (ulong)(uint)ptVar6->tm_sec,uStack_a0 / 100);
            }
            else if (s.time == 0x61) goto LAB_00102ac9;
          }
          else {
            if (s.time == 100) {
              lVar12 = local_a8 - local_90;
              uVar14 = uStack_a0 - local_88;
              uVar9 = uVar14 + 1000000;
              if (-1 < (long)uVar14) {
                uVar9 = uVar14;
              }
              local_88 = uStack_a0;
              local_90 = local_a8;
              local_a8 = ((long)uVar14 >> 0x3f) + lVar12;
              uStack_a0 = uVar9;
            }
            else {
              if (s.time != 0x7a) goto LAB_00102aec;
              if (local_90 == 0) {
                local_90 = local_a8;
                local_88 = uStack_a0;
              }
              uVar9 = uStack_a0 - local_88;
              local_a8 = ((long)uVar9 >> 0x3f) + (local_a8 - local_90);
              uStack_a0 = uVar9 + 1000000;
              if (-1 < (long)uVar9) {
                uStack_a0 = uVar9;
              }
            }
LAB_00102ac9:
            printf("(%llu.%04llu)",local_a8,uStack_a0 / 100);
          }
        }
      }
LAB_00102aec:
      pcVar10 = libj1939_addr2str(&local_48);
      printf(" %s ",pcVar10);
      if ((uVar15 & 4) == 0) {
        if ((uVar15 & 2) == 0) {
          printf("- ");
        }
        else {
          printf("%02x ",local_80 & 0xff);
        }
      }
      else {
        printf("%016llx ",dst_name);
      }
      printf("!%u ",(ulong)bVar7);
      pcVar10 = "...";
      if ((msg.msg_flags & 0x20U) == 0) {
        pcVar10 = "";
      }
      printf("[%i%s]",uVar3 & 0xffffffff,pcVar10);
      if (uVar16 != 0) {
        uVar15 = 0;
        do {
          putchar(0x20);
          if ((uint)uVar15 < uVar16) {
            uVar8 = (uint)uVar15 + 4;
            uVar9 = (ulong)uVar8;
            if (uVar16 <= uVar8) {
              uVar9 = uVar3 & 0xffffffff;
            }
            uVar15 = uVar15 & 0xffffffff;
            do {
              printf("%02x",(ulong)buf[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar9);
          }
        } while ((uint)uVar15 < uVar16);
      }
      putchar(10);
      goto LAB_00102855;
    }
  }
  iVar1 = s.addr.can_ifindex;
  if (*piVar5 == 100) {
    pcVar10 = "ifindex %i";
    uVar13 = 0;
  }
  else {
    pcVar10 = "recvmsg(ifindex %i)";
LAB_00102c02:
    uVar13 = 1;
  }
LAB_00102c07:
  err(uVar13,pcVar10,iVar1);
}

Assistant:

int main(int argc, char **argv)
{
	int ret, sock, opt;
	unsigned int j, len;
	struct timeval tref, tdut, ttmp;
	struct sockaddr_can src;
	struct j1939_filter filt;
	int filter = 0;
	uint8_t priority, dst_addr;
	uint64_t dst_name;
	uint64_t recvflags;

	/* argument parsing */
	while ((opt = getopt_long(argc, argv, optstring, long_opts, NULL)) != -1)
		switch (opt) {
		case 'b':
			s.pkt_len = strtoul(optarg, 0, 0);
			break;
		case 'P':
			++s.promisc;
			break;
		case 't':
			if (optarg) {
				if (!strchr("adzA", optarg[0]))
					err(1, "unknown time option '%c'",
					    optarg[0]);
				s.time = optarg[0];
			} else {
				s.time = 'z';
			}
			break;
		default:
			fputs(help_msg, stderr);
			exit(1);
			break;
		}

	if (argv[optind]) {
		optarg = argv[optind];
		ret = libj1939_str2addr(optarg, 0, &s.addr);
		if (ret < 0) {
			err(0, "bad URI %s", optarg);
			return 1;
		}
	}

	buf = malloc(s.pkt_len);
	if (!buf)
		err(1, "malloc %u", s.pkt_len);

	/* setup socket */
	sock = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (sock < 0)
		err(1, "socket(can, dgram, j1939)");

	memset(&filt, 0, sizeof(filt));
	if (s.addr.can_addr.j1939.name) {
		filt.name = s.addr.can_addr.j1939.name;
		filt.name_mask = ~0ULL;
		++filter;
	}
	if (s.addr.can_addr.j1939.addr < 0xff) {
		filt.addr = s.addr.can_addr.j1939.addr;
		filt.addr_mask = ~0;
		++filter;
	}
	if (s.addr.can_addr.j1939.pgn <= J1939_PGN_MAX) {
		filt.pgn = s.addr.can_addr.j1939.pgn;
		filt.pgn_mask = ~0;
		++filter;
	}
	if (filter) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &filt, sizeof(filt));
		if (ret < 0)
			err(1, "setsockopt filter");
	}

	if (s.promisc) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_PROMISC, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt promisc");
	}

	if (s.time) {
		ret = setsockopt(sock, SOL_SOCKET, SO_TIMESTAMP, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt timestamp");
	}
	ret = setsockopt(sock, SOL_SOCKET, SO_RCVBUF, &s.pkt_len, sizeof(s.pkt_len));
	if (ret < 0)
		err(1, "setsockopt rcvbuf %u", s.pkt_len);

	/* bind(): to default, only ifindex is used. */
	memset(&src, 0, sizeof(src));
	src.can_ifindex = s.addr.can_ifindex;
	src.can_family = AF_CAN;
	src.can_addr.j1939.name = J1939_NO_NAME;
	src.can_addr.j1939.addr = J1939_NO_ADDR;
	src.can_addr.j1939.pgn = J1939_NO_PGN;
	ret = bind(sock, (void *)&src, sizeof(src));
	if (ret < 0)
		err(1, "bind(%s)", argv[1]);

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &buf[0];
	msg.msg_name = &src;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	memset(&tref, 0, sizeof(tref));
	while (1) {
		/* these settings may be modified by recvmsg() */
		iov.iov_len = s.pkt_len;
		msg.msg_namelen = sizeof(src);
		msg.msg_controllen = sizeof(ctrlmsg);
		msg.msg_flags = 0;

		ret = recvmsg(sock, &msg, 0);
		//ret = recvfrom(buf, s.pkt_len, 0, (void *)&addr, &len);
		if (ret < 0) {
			switch (errno) {
			case ENETDOWN:
				err(0, "ifindex %i", s.addr.can_ifindex);
				continue;
			case EINTR:
				continue;
			default:
				err(1, "recvmsg(ifindex %i)", s.addr.can_ifindex);
				break;
			}
		}
		len = ret;
		recvflags = 0;
		dst_addr = 0;
		priority = 0;
		for (cmsg = CMSG_FIRSTHDR(&msg); cmsg; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
			switch (cmsg->cmsg_level) {
			case SOL_SOCKET:
				if (cmsg->cmsg_type == SCM_TIMESTAMP) {
					memcpy(&tdut, CMSG_DATA(cmsg), sizeof(tdut));
					recvflags |= 1ULL << cmsg->cmsg_type;
				}
				break;
			case SOL_CAN_J1939:
				recvflags |= 1ULL << cmsg->cmsg_type;
				if (cmsg->cmsg_type == SCM_J1939_DEST_ADDR)
					dst_addr = *CMSG_DATA(cmsg);
				else if (cmsg->cmsg_type == SCM_J1939_DEST_NAME)
					memcpy(&dst_name, CMSG_DATA(cmsg), cmsg->cmsg_len - CMSG_LEN(0));
				else if (cmsg->cmsg_type == SCM_J1939_PRIO)
					priority = *CMSG_DATA(cmsg);
				break;
			}

		}
		if (recvflags & (1ULL << SCM_TIMESTAMP)) {
			if ('z' == s.time) {
				if (!tref.tv_sec)
					tref = tdut;
				timersub(&tdut, &tref, &ttmp);
				tdut = ttmp;
				goto abs_time;
			} else if ('d' == s.time) {
				timersub(&tdut, &tref, &ttmp);
				tref = tdut;
				tdut = ttmp;
				goto abs_time;
			} else if ('a' == s.time) {
abs_time:
				printf("(%llu.%04llu)", (unsigned long long)tdut.tv_sec, (unsigned long long)tdut.tv_usec / 100);
			} else if ('A' == s.time) {
				struct tm tm;
				tm = *localtime(&tdut.tv_sec);
				printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",
					tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday,
					tm.tm_hour, tm.tm_min, tm.tm_sec,
					(unsigned long long)tdut.tv_usec/100);
			}
		}
		printf(" %s ", libj1939_addr2str(&src));
		if (recvflags & (1ULL << SCM_J1939_DEST_NAME))
			printf("%016llx ", (unsigned long long)dst_name);
		else if (recvflags & (1ULL << SCM_J1939_DEST_ADDR))
			printf("%02x ", dst_addr);
		else
			printf("- ");
		printf("!%u ", priority);

		printf("[%i%s]", len, (msg.msg_flags & MSG_TRUNC) ? "..." : "");
		for (j = 0; j < len;) {
			unsigned int end = j + 4;
			if (end > len)
				end = len;
			printf(" ");
			for (; j < end; ++j)
				printf("%02x", buf[j]);
		}
		printf("\n");
	}

	free(buf);
	return 0;
}